

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.h
# Opt level: O0

void __thiscall Movegen::Movegen(Movegen *this,position *pos)

{
  Move *local_30;
  position *pos_local;
  Movegen *this_local;
  
  this->last = 0;
  local_30 = this->list;
  do {
    Move::Move(local_30);
    local_30 = local_30 + 1;
  } while (local_30 != (Move *)&this->field_0x292);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->bishop_mvs);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->rook_mvs);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->queen_mvs);
  initialize(this,pos);
  return;
}

Assistant:

Movegen(const position& pos) : last(0) { initialize(pos); }